

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_IF_Torus.H
# Opt level: O0

Real __thiscall amrex::EB2::TorusIF::operator()(TorusIF *this,Real x,Real y,Real z)

{
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  Real d;
  
  dVar1 = hypot(in_XMM0_Qa - in_RDI[2],in_XMM1_Qa - in_RDI[3]);
  return in_RDI[6] *
         (-in_RDI[1] * in_RDI[1] +
         (*in_RDI - dVar1) * (*in_RDI - dVar1) + (in_XMM2_Qa - in_RDI[4]) * (in_XMM2_Qa - in_RDI[4])
         );
}

Assistant:

AMREX_GPU_HOST_DEVICE inline
    Real operator() (AMREX_D_DECL(Real x, Real y, Real z)) const noexcept {
        Real d = std::hypot(x-m_center.x, y-m_center.y);
#if (AMREX_SPACEDIM == 2)
        return m_sign*((m_large_radius-d)*(m_large_radius-d)
                       - m_small_radius*m_small_radius);
#else
        return m_sign*((m_large_radius-d)*(m_large_radius-d)
                       +(z-m_center.z)*(z-m_center.z)
                       - m_small_radius*m_small_radius);
#endif
    }